

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

void __thiscall bdNodeManager::addFindNode(bdNodeManager *this,bdNodeId *id,uint32_t qflags)

{
  bool bVar1;
  mapped_type *__dest;
  undefined1 local_80 [8];
  bdQueryPeer peer;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_bdQueryPeer>_> local_28;
  iterator it;
  uint32_t qflags_local;
  bdNodeId *id_local;
  bdNodeManager *this_local;
  
  it._M_node._4_4_ = qflags;
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdQueryPeer>_>::_Rb_tree_iterator(&local_28);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
       ::find(&this->mActivePeers,id);
  peer.mCallbackTS =
       (time_t)std::
               map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
               ::end(&this->mActivePeers);
  bVar1 = std::operator!=(&local_28,(_Self *)&peer.mCallbackTS);
  if (!bVar1) {
    bdQueryPeer::bdQueryPeer((bdQueryPeer *)local_80);
    peer.mId.addr.sin_zero = *(uchar (*) [8])id->data;
    peer.mId.id.data._0_8_ = *(undefined8 *)(id->data + 8);
    peer.mId.id.data._8_4_ = *(undefined4 *)(id->data + 0x10);
    peer.mId.id.data[0xc] = '\x01';
    peer.mId.id.data[0xd] = '\0';
    peer.mId.id.data[0xe] = '\0';
    peer.mId.id.data[0xf] = '\0';
    peer.mId.id.data[0x10] = it._M_node._4_1_;
    peer.mId.id.data[0x11] = it._M_node._5_1_;
    peer.mId.id.data[0x12] = it._M_node._6_1_;
    peer.mId.id.data[0x13] = it._M_node._7_1_;
    peer.mQFlags = 0;
    peer.mStatus._2_2_ = 0;
    peer.mDhtAddr.sin_zero[4] = '\0';
    peer.mDhtAddr.sin_zero[5] = '\0';
    peer.mDhtAddr.sin_zero[6] = '\0';
    peer.mDhtAddr.sin_zero[7] = '\0';
    peer._60_4_ = 0;
    __dest = std::
             map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
             ::operator[](&this->mActivePeers,id);
    memcpy(__dest,local_80,0x48);
  }
  return;
}

Assistant:

void bdNodeManager::addFindNode(bdNodeId *id, uint32_t qflags) {
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::addFindNode() ";
	mDhtFns->bdPrintNodeId(std::cerr, id);
	std::cerr << std::endl;
#endif
	/* check if exists already */
	std::map<bdNodeId, bdQueryPeer>::iterator it;	
	it = mActivePeers.find(*id);
	if (it != mActivePeers.end()) {
#ifdef DEBUG_MGR
		std::cerr << "bdNodeManager::addFindNode() Found existing....";
		std::cerr << std::endl;
#endif
		return;
	}

	/* add to map */
	bdQueryPeer peer;
	peer.mId.id = (*id);
	peer.mStatus = BITDHT_QUERY_READY; //QUERYING;
	peer.mQFlags = qflags;

	peer.mDhtAddr.sin_addr.s_addr = 0;
	peer.mDhtAddr.sin_port = 0;

	peer.mCallbackTS = 0;

	mActivePeers[*id] = peer;
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::addFindNode() Added QueryPeer as READY....";
	std::cerr << std::endl;
#endif
	//addQuery(id, qflags | BITDHT_QFLAGS_DISGUISE); 
	return;
}